

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O1

int available_fds(uint n)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int fds [256];
  int local_428 [258];
  
  iVar1 = 1;
  if (n < 0x101) {
    if (n != 0) {
      uVar3 = 0;
      do {
        local_428[uVar3] = -1;
        iVar1 = socket(2,2,0);
        local_428[uVar3] = iVar1;
        if (iVar1 < 0) {
          iVar1 = 1;
          goto LAB_00105a34;
        }
        uVar3 = uVar3 + 1;
      } while (n != uVar3);
    }
    iVar1 = 0;
LAB_00105a34:
    if (n != 0) {
      lVar2 = 0;
      do {
        if (local_428[lVar2] < 0) {
          return iVar1;
        }
        close(local_428[lVar2]);
        lVar2 = lVar2 + 1;
      } while (n != (uint)lVar2);
    }
  }
  return iVar1;
}

Assistant:

int
available_fds(unsigned int n)
{
	unsigned int	i;
	int		ret, fds[256];

	if (n > (sizeof(fds)/sizeof(fds[0])))
		return (1);

	ret = 0;
	for (i = 0; i < n; i++) {
		fds[i] = -1;
		if ((fds[i] = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
			ret = 1;
			break;
		}
	}

	for (i = 0; i < n && fds[i] >= 0; i++)
		close(fds[i]);

	return (ret);
}